

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

char * XML_GetInputContext(XML_Parser parser,int *offset,int *size)

{
  int *size_local;
  int *offset_local;
  XML_Parser parser_local;
  
  if (parser == (XML_Parser)0x0) {
    parser_local = (XML_Parser)0x0;
  }
  else if ((parser->m_eventPtr == (char *)0x0) || (parser->m_buffer == (char *)0x0)) {
    parser_local = (XML_Parser)0x0;
  }
  else {
    if (offset != (int *)0x0) {
      *offset = (int)parser->m_eventPtr - (int)parser->m_buffer;
    }
    if (size != (int *)0x0) {
      *size = (int)parser->m_bufferEnd - (int)parser->m_buffer;
    }
    parser_local = (XML_Parser)parser->m_buffer;
  }
  return (char *)parser_local;
}

Assistant:

const char * XMLCALL
XML_GetInputContext(XML_Parser parser, int *offset, int *size)
{
#ifdef XML_CONTEXT_BYTES
  if (parser == NULL)
    return NULL;
  if (eventPtr && buffer) {
    if (offset != NULL)
      *offset = (int)(eventPtr - buffer);
    if (size != NULL)
      *size   = (int)(bufferEnd - buffer);
    return buffer;
  }
#else
  (void)parser;
  (void)offset;
  (void)size;
#endif /* defined XML_CONTEXT_BYTES */
  return (char *) 0;
}